

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O2

double function_norm_C(double *node_values,uint dimension,_func_double_double *function)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (dimension < 3) {
    __assert_fail("dimension >= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tenpercent[P]navier-stokes/src/pdesolver/norm.c"
                  ,0x2c,"double function_norm_C(const double *, unsigned int, double (*)(double))");
  }
  dVar3 = (*function)(node_values[1]);
  uVar2 = 2;
  dVar3 = ABS(dVar3);
  while (dVar4 = dVar3, dimension - 1 != uVar2) {
    pdVar1 = node_values + uVar2;
    uVar2 = uVar2 + 1;
    dVar5 = (*function)(*pdVar1);
    dVar3 = ABS(dVar5);
    if (ABS(dVar5) <= dVar4) {
      dVar3 = dVar4;
    }
  }
  return dVar4;
}

Assistant:

double function_norm_C (double const * node_values,
                        unsigned dimension,
                        double (*function) (double)) {

  assert (dimension >= 3);

  double norm = fabs (function (node_values[1]));
  unsigned space_step;
  for (space_step = 2; space_step + 1 < dimension; ++space_step) {
    norm = max (fabs (function (node_values[space_step])), norm);
  }
  return norm;
}